

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
TOIDecPOMDPDiscrete::SetIndividualDecPOMDPD
          (TOIDecPOMDPDiscrete *this,DecPOMDPDiscrete *model,Index agentI)

{
  pointer ppDVar1;
  
  ppDVar1 = (this->_m_individualDecPOMDPDs).
            super__Vector_base<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->_m_individualDecPOMDPDs).
                    super__Vector_base<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3) <= (ulong)agentI
     ) {
    std::vector<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>::resize
              (&this->_m_individualDecPOMDPDs,(ulong)(agentI + 1));
    ppDVar1 = (this->_m_individualDecPOMDPDs).
              super__Vector_base<DecPOMDPDiscrete_*,_std::allocator<DecPOMDPDiscrete_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  ppDVar1[agentI] = model;
  return;
}

Assistant:

void TOIDecPOMDPDiscrete::SetIndividualDecPOMDPD(DecPOMDPDiscrete *model,
                                                 Index agentI)
{
    if(_m_individualDecPOMDPDs.size()<=agentI)
        _m_individualDecPOMDPDs.resize(agentI+1);

    _m_individualDecPOMDPDs[agentI]=model;
}